

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_pubkey_create_helper
              (secp256k1_ecmult_gen_context *ecmult_gen_ctx,secp256k1_scalar *seckey_scalar,
              secp256k1_ge *p,uchar *seckey)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  secp256k1_scalar sVar6;
  int vflag;
  unsigned_long _zzq_result;
  secp256k1_gej pj;
  secp256k1_gej local_b8;
  
  *seckey_scalar = 0;
  lVar4 = 0;
  bVar5 = false;
  sVar6 = 0;
  do {
    sVar6 = (uint)seckey[lVar4] | sVar6 << 8;
    if (0xc < sVar6) {
      bVar5 = true;
      sVar6 = sVar6 - (sVar6 / 0xd + (sVar6 / 0xd) * 0xc);
    }
    *seckey_scalar = sVar6;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x20);
  bVar5 = sVar6 != 0 && !bVar5;
  uVar3 = bVar5 ^ 1;
  local_b8.x.n[0] = 0x4d430005;
  local_b8.x.n[2] = 4;
  local_b8.x.n[3] = 0;
  local_b8.x.n[4] = 0;
  local_b8.x.magnitude = 0;
  local_b8.x.normalized = 0;
  uVar1 = (ulong)((long)ecmult_gen_ctx << 3) >> 0x33;
  uVar2 = (((long)ecmult_gen_ctx << 3 | (ulong)ecmult_gen_ctx >> 0x3d) << 0xd | uVar1) >> 3;
  *seckey_scalar = uVar3 | uVar3 - 1 & *seckey_scalar;
  local_b8.x.n[1] = (uint64_t)seckey_scalar;
  secp256k1_ecmult_gen
            ((secp256k1_ecmult_gen_context *)(uVar2 << 0x33 | (uVar1 << 0x3d | uVar2) >> 0xd),
             &local_b8,seckey_scalar);
  secp256k1_ge_set_gej(p,&local_b8);
  return (uint)bVar5;
}

Assistant:

static int secp256k1_ec_pubkey_create_helper(const secp256k1_ecmult_gen_context *ecmult_gen_ctx, secp256k1_scalar *seckey_scalar, secp256k1_ge *p, const unsigned char *seckey) {
    secp256k1_gej pj;
    int ret;

    ret = secp256k1_scalar_set_b32_seckey(seckey_scalar, seckey);
    secp256k1_scalar_cmov(seckey_scalar, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(ecmult_gen_ctx, &pj, seckey_scalar);
    secp256k1_ge_set_gej(p, &pj);
    return ret;
}